

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderBullet(ImVec2 pos)

{
  float fVar1;
  ImDrawList *this;
  ImU32 col;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 pos_local;
  
  this = GImGui->CurrentWindow->DrawList;
  fVar1 = GImGui->FontSize;
  g = (ImGuiContext *)pos;
  col = GetColorU32(0,1.0);
  ImDrawList::AddCircleFilled(this,(ImVec2 *)&g,fVar1 * 0.2,col,8);
  return;
}

Assistant:

void ImGui::RenderBullet(ImVec2 pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DrawList->AddCircleFilled(pos, GImGui->FontSize*0.20f, GetColorU32(ImGuiCol_Text), 8);
}